

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int orbit_prune(saucy *s)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *cell;
  int size;
  int k;
  int min;
  int fixed;
  int label;
  int i;
  saucy *s_local;
  
  size = -1;
  iVar1 = s->start[s->lev];
  iVar2 = (s->right).clen[iVar1];
  piVar3 = (s->right).lab;
  for (fixed = 0; fixed < iVar2; fixed = fixed + 1) {
    if ((piVar3[(long)iVar1 + (long)iVar2] < piVar3[(long)iVar1 + (long)fixed]) &&
       ((size == -1 || (piVar3[(long)iVar1 + (long)fixed] <= piVar3[(long)iVar1 + (long)size])))) {
      size = fixed;
    }
  }
  return size;
}

Assistant:

static int
orbit_prune(struct saucy *s)
{
    int i, label, fixed, min = -1;
    int k = s->start[s->lev];
    int size = s->right.clen[k] + 1;
    int *cell = s->right.lab + k;

    /* The previously fixed value */
    fixed = cell[size-1];

    /* Look for the next minimum cell representative */
    for (i = 0; i < size-1; ++i) {
        label = cell[i];

        /* Skip things we've already considered */
        if (label <= fixed) continue;

        /* Skip things that we'll consider later */
        if (min != -1 && label > cell[min]) continue;

        /* New candidate minimum */
        min = i;
    }

    return min;
}